

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

float Abc_SclCountNonBufferLoadInt(SC_Man *p,Abc_Obj_t *pObj)

{
  float fVar1;
  float fVar2;
  int iVar3;
  Abc_Obj_t *pObj_00;
  SC_Pair *pSVar4;
  SC_Cell *pSVar5;
  SC_Pin *pSVar6;
  float fVar7;
  int local_30;
  float local_2c;
  int i;
  float Load;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  local_2c = 0.0;
  iVar3 = Abc_ObjIsBuffer(pObj);
  if (iVar3 == 0) {
    p_local._4_4_ = 0.0;
  }
  else {
    for (local_30 = 0; iVar3 = Abc_ObjFanoutNum(pObj), local_30 < iVar3; local_30 = local_30 + 1) {
      pObj_00 = Abc_ObjFanout(pObj,local_30);
      fVar7 = Abc_SclCountNonBufferLoadInt(p,pObj_00);
      local_2c = fVar7 + local_2c;
    }
    pSVar4 = Abc_SclObjLoad(p,pObj);
    fVar7 = pSVar4->rise;
    pSVar4 = Abc_SclObjLoad(p,pObj);
    fVar1 = pSVar4->fall;
    pSVar5 = Abc_SclObjCell(pObj);
    pSVar6 = SC_CellPin(pSVar5,0);
    fVar2 = pSVar6->rise_cap;
    pSVar5 = Abc_SclObjCell(pObj);
    pSVar6 = SC_CellPin(pSVar5,0);
    p_local._4_4_ = (local_2c + fVar7 * 0.5 + fVar1 * 0.5) - (fVar2 * 0.5 + pSVar6->fall_cap * 0.5);
  }
  return p_local._4_4_;
}

Assistant:

float Abc_SclCountNonBufferLoadInt( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load = 0;
    int i; 
    if ( !Abc_ObjIsBuffer(pObj) )
        return 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Abc_SclCountNonBufferLoadInt( p, pFanout );
    Load += 0.5 * Abc_SclObjLoad(p, pObj)->rise + 0.5 * Abc_SclObjLoad(p, pObj)->fall;
    Load -= 0.5 * SC_CellPin(Abc_SclObjCell(pObj), 0)->rise_cap + 0.5 * SC_CellPin(Abc_SclObjCell(pObj), 0)->fall_cap;
    return Load;
}